

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O0

int __thiscall ncnn::GRU::load_param(GRU *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xd0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,0);
  *(int *)(in_RDI + 0xd4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,2,0);
  *(int *)(in_RDI + 0xd8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,8,0);
  *(int *)(in_RDI + 0xdc) = iVar1;
  return 0;
}

Assistant:

int GRU::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    weight_data_size = pd.get(1, 0);
    direction = pd.get(2, 0);
    int8_scale_term = pd.get(8, 0);

    if (int8_scale_term)
    {
#if !NCNN_INT8
        NCNN_LOGE("please build ncnn with NCNN_INT8 enabled for int8 inference");
        return -1;
#endif
    }

    return 0;
}